

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedSSOSubroutine::Run(AdvancedSSOSubroutine *this)

{
  CallLogWrapper *pCVar1;
  GLuint GVar2;
  GLsizei width;
  GLint GVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar8;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined8 uVar9;
  ulong uVar10;
  int h;
  uint uVar11;
  int h_1;
  allocator_type local_61;
  CallLogWrapper *local_60;
  undefined8 local_58;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint indices [2];
  
  pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar2 = this->m_program;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar2,"g_image0");
  glu::CallLogWrapper::glProgramUniform1i(pCVar1,GVar2,GVar3,1);
  GVar2 = this->m_program;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar2,"g_image1");
  glu::CallLogWrapper::glProgramUniform1i(pCVar1,GVar2,GVar3,1);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,this->m_texture);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2601);
  iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  glu::CallLogWrapper::glTexImage3D
            (pCVar1,0x8c1a,0,0x8814,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar4) + 4),3,0,
             0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0xc01,&this->m_draw_buffer);
  glu::CallLogWrapper::glDrawBuffer(pCVar1,0);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,1,this->m_texture,0,'\x01',0,0x88ba,0x8814);
  glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
  glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_attribless_vao);
  indices[0] = glu::CallLogWrapper::glGetSubroutineIndex(pCVar1,this->m_program,0x8b30,"Brush0");
  indices[1] = glu::CallLogWrapper::glGetSubroutineIndex(pCVar1,this->m_program,0x8b30,"Brush1");
  glu::CallLogWrapper::glUniformSubroutinesuiv(pCVar1,0x8b30,1,indices);
  glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(pCVar1,4,0,3,1,0);
  iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)CONCAT44(extraout_var_01,iVar4);
  iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,(long)(iVar4 * *(int *)(CONCAT44(extraout_var_02,iVar5) + 4) * 3),&local_61);
  glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
  uVar10 = 0;
  glu::CallLogWrapper::glGetTexImage
            (pCVar1,0x8c1a,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  uVar9 = 0;
  local_60 = pCVar1;
  do {
    iVar4 = 0;
    local_58 = uVar9;
    while( true ) {
      iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      pCVar1 = local_60;
      uVar11 = (uint)uVar10;
      if (*(int *)(CONCAT44(extraout_var_03,iVar5) + 4) <= iVar4) break;
      iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      if (0 < *(int *)CONCAT44(extraout_var_04,iVar5)) {
        iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar5 = *(int *)CONCAT44(extraout_var_05,iVar5);
        iVar6 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar6 = *(int *)(CONCAT44(extraout_var_06,iVar6) + 4);
        iVar7 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar4 = *(int *)CONCAT44(extraout_var_07,iVar7) * iVar4 + iVar6 * uVar11 * iVar5;
        lVar8 = (*(code *)((long)&DAT_01aaa8f4 + (long)(int)(&DAT_01aaa8f4)[uVar10]))
                          (data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0],
                           data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1],
                           data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2],
                           data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[3],0);
        return lVar8;
      }
      iVar4 = iVar4 + 1;
    }
    uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),1 < uVar11);
    uVar10 = (ulong)(uVar11 + 1);
    if (uVar11 + 1 == 3) {
      glu::CallLogWrapper::glUniformSubroutinesuiv(local_60,0x8b30,1,indices + 1);
      glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(pCVar1,4,0,3,1,0);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
      uVar10 = 0;
      glu::CallLogWrapper::glGetTexImage
                (pCVar1,0x8c1a,0,0x1908,0x1406,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      local_60 = (CallLogWrapper *)CONCAT71(local_60._1_7_,1);
      do {
        h_1 = 0;
        uVar11 = (uint)uVar10;
        while( true ) {
          iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          iVar4 = *(int *)(CONCAT44(extraout_var_08,iVar4) + 4);
          if (iVar4 <= h_1) break;
          local_58 = CONCAT44(local_58._4_4_,iVar4);
          iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          if (0 < *(int *)CONCAT44(extraout_var_09,iVar4)) {
            iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar4 = *(int *)CONCAT44(extraout_var_10,iVar4);
            iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar5 = *(int *)(CONCAT44(extraout_var_11,iVar5) + 4);
            iVar6 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar4 = *(int *)CONCAT44(extraout_var_12,iVar6) * h_1 + iVar5 * uVar11 * iVar4;
            lVar8 = (*(code *)((long)&DAT_01aaa904 + (long)(int)(&DAT_01aaa904)[uVar10]))
                              (data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0],
                               data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1],
                               data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2],
                               data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[3]);
            return lVar8;
          }
          h_1 = h_1 + 1;
        }
        local_60 = (CallLogWrapper *)CONCAT71(local_60._1_7_,uVar11 < 2);
        uVar10 = (ulong)(uVar11 + 1);
        if (uVar11 + 1 == 3) {
          if (data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          return -(ulong)(uVar11 < 2);
        }
      } while( true );
    }
  } while( true );
}

Assistant:

virtual long Run()
	{
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image0"), 1);
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image1"), 1);

		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 3, 0, GL_RGBA, GL_FLOAT,
					 NULL);

		glGetIntegerv(GL_DRAW_BUFFER, &m_draw_buffer);

		glDrawBuffer(GL_NONE);
		glBindImageTexture(1, m_texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_RGBA32F);
		glUseProgram(m_program);
		glBindVertexArray(m_attribless_vao);

		const GLuint indices[2] = { glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush0"),
									glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush1") };

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[0]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		std::vector<vec4> data(getWindowWidth() * getWindowHeight() * 3);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[1]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}
		return NO_ERROR;
	}